

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
SmallArray<HashMap<unsigned_int>::Node_*,_32U>::~SmallArray
          (SmallArray<HashMap<unsigned_int>::Node_*,_32U> *this)

{
  SmallArray<HashMap<unsigned_int>::Node_*,_32U> *this_local;
  
  if (this->data != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      NULLC::destruct<HashMap<unsigned_int>::Node*>(this->data,(ulong)this->max);
    }
    else {
      Allocator::destruct<HashMap<unsigned_int>::Node*>(this->allocator,this->data,(ulong)this->max)
      ;
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}